

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cldperm.c
# Opt level: O3

int cldperm(int job,int n,int_t nnz,int_t *colptr,int_t *adjncy,singlecomplex *nzval,int *perm,
           float *u,float *v)

{
  ulong uVar1;
  double *addr;
  int_t *addr_00;
  ulong uVar2;
  double *a;
  long lVar3;
  double dVar4;
  int_t ln;
  int_t ljob;
  int_t num;
  int_t nnz_local;
  int_t ldw;
  int_t local_184;
  double *local_180;
  double *local_178;
  int_t *local_170;
  int_t info [10];
  int_t icntl [10];
  
  uVar1 = (ulong)(uint)n;
  nnz_local = nnz;
  local_180 = (double *)superlu_malloc((long)nnz * 8);
  local_184 = nnz + n * 10;
  if (job != 3) {
    local_184 = n * 5;
  }
  local_170 = intMalloc(local_184);
  if (local_170 == (int_t *)0x0) {
    sprintf((char *)icntl,"%s at line %d in file %s\n","Malloc fails for iw[]",0x6f,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/cldperm.c");
    superlu_abort_and_exit((char *)icntl);
  }
  ldw = n * 3 + nnz;
  local_178 = (double *)superlu_malloc((long)ldw << 3);
  if (local_178 == (double *)0x0) {
    sprintf((char *)icntl,"%s at line %d in file %s\n","Malloc fails for dw[]",0x72,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/cldperm.c");
    superlu_abort_and_exit((char *)icntl);
  }
  a = local_180;
  if (-1 < n) {
    uVar2 = 0;
    do {
      colptr[uVar2] = colptr[uVar2] + 1;
      uVar2 = uVar2 + 1;
    } while (n + 1 != uVar2);
  }
  ln = n;
  ljob = job;
  if (nnz < 1) {
    mc64id_(icntl);
    a = local_180;
  }
  else {
    uVar2 = 0;
    do {
      adjncy[uVar2] = adjncy[uVar2] + 1;
      uVar2 = uVar2 + 1;
    } while ((uint)nnz != uVar2);
    mc64id_(icntl);
    if (0 < nnz) {
      lVar3 = 0;
      do {
        dVar4 = c_abs1(nzval);
        a[lVar3] = dVar4;
        lVar3 = lVar3 + 1;
        nzval = nzval + 1;
      } while (lVar3 < nnz);
    }
  }
  addr_00 = local_170;
  mc64ad_(&ljob,&ln,&nnz_local,colptr,adjncy,a,&num,perm,&local_184,local_170,&ldw,local_178,icntl,
          info);
  if (info[0] == 1) {
    printf(".. The last %d permutations:\n",(ulong)(uint)(n - num));
    slu_PrintInt10("perm",n - num,perm + num);
  }
  addr = local_178;
  if (-1 < n) {
    uVar2 = 0;
    do {
      colptr[uVar2] = colptr[uVar2] + -1;
      uVar2 = uVar2 + 1;
    } while (n + 1 != uVar2);
  }
  if (0 < (long)nnz_local) {
    lVar3 = 0;
    do {
      adjncy[lVar3] = adjncy[lVar3] + -1;
      lVar3 = lVar3 + 1;
    } while (nnz_local != lVar3);
  }
  if (0 < n) {
    uVar2 = 0;
    do {
      perm[uVar2] = perm[uVar2] + -1;
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
    if (job == 5 && 0 < n) {
      uVar2 = 0;
      do {
        u[uVar2] = (float)local_178[uVar2];
        v[uVar2] = (float)local_178[uVar1 + uVar2];
        uVar2 = uVar2 + 1;
      } while (uVar1 != uVar2);
    }
  }
  superlu_free(addr_00);
  superlu_free(addr);
  superlu_free(a);
  return info[0];
}

Assistant:

int
cldperm(int job, int n, int_t nnz, int_t colptr[], int_t adjncy[],
	singlecomplex nzval[], int *perm, float u[], float v[])
{
    int_t i, num;
    int_t icntl[10], info[10];
    int_t liw, ldw, *iw;
    double *dw;
    double *nzval_d = (double *) SUPERLU_MALLOC(nnz * sizeof(double));

#if ( DEBUGlevel>=1 )
    CHECK_MALLOC("Enter cldperm()");
#endif
    liw = 5*n;
    if ( job == 3 ) liw = 10*n + nnz;
    if ( !(iw = intMalloc(liw)) ) ABORT("Malloc fails for iw[]");
    ldw = 3*n + nnz;
    if ( !(dw = (double*) SUPERLU_MALLOC(ldw * sizeof(double))) )
          ABORT("Malloc fails for dw[]");
	    
    /* Increment one to get 1-based indexing. */
    for (i = 0; i <= n; ++i) ++colptr[i];
    for (i = 0; i < nnz; ++i) ++adjncy[i];
#if ( DEBUGlevel>=2 )
    printf("LDPERM(): n %d, nnz %lld\n", n, (long long) nnz);
    slu_PrintInt10("colptr", n+1, colptr);
    slu_PrintInt10("adjncy", nnz, adjncy);
#endif
	
    /* 
     * NOTE:
     * =====
     *
     * MC64AD assumes that column permutation vector is defined as:
     * perm(i) = j means column i of permuted A is in column j of original A.
     *
     * Since a symmetric permutation preserves the diagonal entries. Then
     * by the following relation:
     *     P'(A*P')P = P'A
     * we can apply inverse(perm) to rows of A to get large diagonal entries.
     * But, since 'perm' defined in MC64AD happens to be the reverse of
     * SuperLU's definition of permutation vector, therefore, it is already
     * an inverse for our purpose. We will thus use it directly.
     *
     */
    mc64id_(icntl);
#if 0
    /* Suppress error and warning messages. */
    icntl[0] = -1;
    icntl[1] = -1;
#endif

    int_t ljob = job, ln = n;
    
    for (i = 0; i < nnz; ++i) nzval_d[i] = c_abs1(&nzval[i]);
    mc64ad_(&ljob, &ln, &nnz, colptr, adjncy, nzval_d, &num, perm,
	    &liw, iw, &ldw, dw, icntl, info);

#if ( DEBUGlevel>=2 )
    slu_PrintInt10("perm", n, perm);
    printf(".. After MC64AD info %lld\tsize of matching %lld\n", (long long)info[0], (long long) num);
#endif
    if ( info[0] == 1 ) { /* Structurally singular */
        printf(".. The last %d permutations:\n", (int)(n-num));
	slu_PrintInt10("perm", n-num, &perm[num]);
    }

    /* Restore to 0-based indexing. */
    for (i = 0; i <= n; ++i) --colptr[i];
    for (i = 0; i < nnz; ++i) --adjncy[i];
    for (i = 0; i < n; ++i) --perm[i];

    if ( job == 5 )
        for (i = 0; i < n; ++i) {
	    u[i] = dw[i];
	    v[i] = dw[n+i];
	}

    SUPERLU_FREE(iw);
    SUPERLU_FREE(dw);
    SUPERLU_FREE(nzval_d);

#if ( DEBUGlevel>=1 )
    CHECK_MALLOC("Exit cldperm()");
#endif

    return info[0];
}